

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.c
# Opt level: O2

int invalid_name(uchar *ptr,int nonnull)

{
  long lVar1;
  
  lVar1 = 0;
  while( true ) {
    if ((int)lVar1 == 0x20) {
      return 0;
    }
    if (ptr[lVar1] != '\0' && 0x5e < (byte)(ptr[lVar1] - 0x20)) break;
    lVar1 = lVar1 + 1;
  }
  return 1;
}

Assistant:

static int invalid_name(const unsigned char *ptr, int nonnull)
{
	int i;
	for (i = 0; i < NAME_LEN; i++) {
		if (!is_printable(*ptr) && *ptr != 0) {
			return 1;
		}
		if (nonnull && i == 0 && *ptr == 0) {
			return 1;
		}
		ptr++;
	}
	return 0;
}